

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 04.cpp
# Opt level: O1

int main(void)

{
  size_t sVar1;
  long *plVar2;
  long lVar3;
  char *pcVar4;
  bool x;
  char eme [8];
  char local_19;
  char local_18 [8];
  
  setlocale(6,"");
  builtin_strncpy(local_18,"\x1b[1;37m",8);
  sVar1 = strlen(local_18);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_18,sVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,anon_var_dwarf_8f9,0x37);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'H');
  std::ostream::put('H');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Nietzsche era antisemita?",0x19);
  std::istream::_M_extract<bool>((bool *)&std::cin);
  if (local_19 == '\x01') {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,anon_var_dwarf_925,0x3c);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "Que carecia de superacao. Isso nada tinha haver com os Judeus ",0x3e);
    pcVar4 = "especificamente.";
    lVar3 = 0x10;
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,anon_var_dwarf_967,0x41);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"que era absolutamente preconceituosa e desejava ",0x30);
    pcVar4 = "a todo custo, associar a imagem dele ao antisemitismo.";
    lVar3 = 0x36;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar4,lVar3);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'H');
  std::ostream::put('H');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"--------------------------------------------------------",0x38);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'H');
  std::ostream::put('H');
  plVar2 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Nietzsche acreditava em Deus?",0x1d);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'H');
  std::ostream::put('H');
  std::ostream::flush();
  std::istream::_M_extract<bool>((bool *)&std::cin);
  if (local_19 == '\x01') {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,anon_var_dwarf_9d5,0x3a);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"O Deus que era constantemente usado para promover  ",0x33);
    pcVar4 = anon_var_dwarf_a01;
    lVar3 = 0x29;
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,anon_var_dwarf_a17,0x3b);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Estava de Deus. E com isso declarou: \'O ultimo verdadeiro ",
               0x3a);
    pcVar4 = anon_var_dwarf_a37;
    lVar3 = 0x35;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar4,lVar3);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"--------------------------------------------------------------",
             0x3e);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'H');
  std::ostream::put('H');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Nietzsche era Niilista? ",0x18);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'H');
  std::ostream::put('H');
  std::ostream::flush();
  std::istream::_M_extract<bool>((bool *)&std::cin);
  if (local_19 == '\x01') {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "Nietzsche se considerava Niilista quando partia do pressuposto ",0x3f);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,anon_var_dwarf_a83,0x33);
    pcVar4 = "Nos acompanha tambem o amor pela vontade e pela vida, acima de tudo.";
    lVar3 = 0x44;
  }
  else {
    pcVar4 = "Errado. Leia os primeiros capitulos de \'ECCE HOMO\'";
    lVar3 = 0x32;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar4,lVar3);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'H');
  std::ostream::put('H');
  std::ostream::flush();
  return 0;
}

Assistant:

int main()
{
    setlocale(LC_ALL, "");
    char eme[] = {0x1b, '[', '1', ';', '3', '7', 'm', 0};
    cout << eme;
    bool x;

    cout << "Responda as alternativas com 1 para sim e 0 para não: " << endl;
    cout << "Nietzsche era antisemita?";
    cin >> x;

    if (x == true)
    {
        cout << "Nooopz! Nietzsche falava que o homem em sí era incompleto. ";
        cout << "Que carecia de superacao. Isso nada tinha haver com os Judeus ";
        cout << "especificamente." << endl;
    }
    else
    {
        cout << "Isso! Na verdade, essa idéia foi criada pela irmã de Nietzsche ";
        cout << "que era absolutamente preconceituosa e desejava ";
        cout << "a todo custo, associar a imagem dele ao antisemitismo." << endl;
    }
    cout << "--------------------------------------------------------" << endl
         << endl;
    cout << "Nietzsche acreditava em Deus?" << endl;
    cin >> x;

    if (x == 1)
    {
        cout << "YESS!Nietzsche não acreditava no Deus criado pelo homem. ";
        cout << "O Deus que era constantemente usado para promover  ";
        cout << "guerras, dor e martírios involuntários.";
    }
    else
    {
        cout << "Resposta errada. Nietzsche sabia da distância que o homem ";
        cout << "Estava de Deus. E com isso declarou: 'O ultimo verdadeiro ";
        cout << "Cristao morreu na cruz', dentre outras declarações.";
    }

    cout << "--------------------------------------------------------------" << endl;
    cout << "Nietzsche era Niilista? " << endl;
    cin >> x;

    if (x == 1)
    {
        cout << "Nietzsche se considerava Niilista quando partia do pressuposto ";
        cout << "que quando assumimos o nada, não estamos sozinhos.";
        cout << "Nos acompanha tambem o amor pela vontade e pela vida, acima de tudo." << endl;
    }
    else
    {
        cout << "Errado. Leia os primeiros capitulos de 'ECCE HOMO'" << endl;
    }
    return 0;
}